

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)15>_> * __thiscall
vkt::synchronization::PipelineCacheData::createPipelineCache
          (Move<vk::Handle<(vk::HandleType)15>_> *__return_storage_ptr__,PipelineCacheData *this,
          DeviceInterface *vk,VkDevice device)

{
  bool bVar1;
  const_reference local_90;
  undefined1 local_58 [8];
  VkPipelineCacheCreateInfo params;
  ScopedLock dataLock;
  VkDevice device_local;
  DeviceInterface *vk_local;
  PipelineCacheData *this_local;
  
  de::ScopedLock::ScopedLock((ScopedLock *)&params.pInitialData,&this->m_lock);
  local_58._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO;
  params.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  params._4_4_ = 0;
  params.pNext._0_4_ = 0;
  params._16_8_ = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_data);
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->m_data);
  if (bVar1) {
    local_90 = (const_reference)0x0;
  }
  else {
    local_90 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->m_data,0);
  }
  params.initialDataSize = (deUintptr)local_90;
  ::vk::createPipelineCache
            (__return_storage_ptr__,vk,device,(VkPipelineCacheCreateInfo *)local_58,
             (VkAllocationCallbacks *)0x0);
  de::ScopedLock::~ScopedLock((ScopedLock *)&params.pInitialData);
  return __return_storage_ptr__;
}

Assistant:

vk::Move<VkPipelineCache> PipelineCacheData::createPipelineCache (const vk::DeviceInterface& vk, const vk::VkDevice device) const
{
	const de::ScopedLock						dataLock	(m_lock);
	const struct vk::VkPipelineCacheCreateInfo	params	=
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO,
		DE_NULL,
		(vk::VkPipelineCacheCreateFlags)0,
		(deUintptr)m_data.size(),
		(m_data.empty() ? DE_NULL : &m_data[0])
	};

	return vk::createPipelineCache(vk, device, &params);
}